

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O2

Key icu_63::unisets::chooseFrom(UnicodeString *str,Key key1,Key key2)

{
  UBool UVar1;
  UnicodeSet *this;
  UnicodeString UStack_58;
  
  this = get(key1);
  UVar1 = UnicodeSet::contains(this,str);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString(&UStack_58,str);
    key1 = chooseFrom(&UStack_58,key2);
    UnicodeString::~UnicodeString(&UStack_58);
  }
  return key1;
}

Assistant:

Key unisets::chooseFrom(UnicodeString str, Key key1, Key key2) {
    return get(key1)->contains(str) ? key1 : chooseFrom(str, key2);
}